

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Glucose::Solver::toDimacs(Solver *this,FILE *f,vec<Glucose::Lit> *assumps)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  Var VVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int x;
  ulong uVar12;
  Clause *c;
  ulong uVar13;
  long lVar14;
  Var max;
  uint local_4c;
  vec<int> local_48;
  FILE *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_48.data = (int *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  local_4c = 0;
  iVar1 = (this->clauses).sz;
  uVar13 = (ulong)iVar1;
  if ((long)uVar13 < 1) {
    iVar10 = 0;
    uVar13 = 0;
  }
  else {
    puVar3 = (this->clauses).data;
    puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    uVar12 = 0;
    iVar10 = 0;
    local_38 = (FILE *)f;
    do {
      bVar5 = satisfied(this,(Clause *)(puVar4 + puVar3[uVar12]));
      iVar10 = iVar10 + (uint)!bVar5;
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
    if (iVar1 < 1) {
      uVar13 = 0;
      f = (FILE *)local_38;
    }
    else {
      lVar9 = 0;
      do {
        c = (Clause *)
            ((this->ca).super_RegionAllocator<unsigned_int>.memory + (this->clauses).data[lVar9]);
        bVar5 = satisfied(this,c);
        if ((!bVar5) && (lVar7 = *(long *)&c->header, 0 < (int)((ulong)lVar7 >> 0x20))) {
          lVar14 = 0;
          do {
            iVar1 = *(int *)(&c[1].header.field_0x0 + lVar14 * 4);
            x = iVar1 >> 1;
            if (((byte)iVar1 & 1 ^ (this->assigns).data[x].value) != 1) {
              mapVar(x,&local_48,(Var *)&local_4c);
              lVar7 = *(long *)&c->header;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < lVar7 >> 0x20);
          uVar13 = (ulong)(uint)(this->clauses).sz;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)uVar13);
      uVar13 = (ulong)local_4c;
      f = (FILE *)local_38;
    }
  }
  uVar11 = iVar10 + (this->assumptions).sz;
  fprintf((FILE *)f,"p cnf %d %d\n",uVar13,(ulong)uVar11);
  if (0 < (this->assumptions).sz) {
    lVar9 = 0;
    do {
      uVar2 = (this->assumptions).data[lVar9].x;
      VVar6 = mapVar((int)uVar2 >> 1,&local_48,(Var *)&local_4c);
      pcVar8 = "-";
      if ((uVar2 & 1) == 0) {
        pcVar8 = "";
      }
      fprintf((FILE *)f,"%s%d 0\n",pcVar8,(ulong)(VVar6 + 1));
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->assumptions).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar9 = 0;
    do {
      toDimacs(this,f,(Clause *)
                      ((this->ca).super_RegionAllocator<unsigned_int>.memory +
                      (this->clauses).data[lVar9]),&local_48,(Var *)&local_4c);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("Wrote %d clauses with %d variables.\n",(ulong)uVar11,(ulong)local_4c);
  }
  if (local_48.data != (int *)0x0) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    free(local_48.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, const vec <Lit> &assumps) {
    // Handle case when solver is in contradictory state:
    if(!ok) {
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return;
    }

    vec <Var> map;
    Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for(int i = 0; i < clauses.size(); i++)
        if(!satisfied(ca[clauses[i]]))
            cnt++;

    for(int i = 0; i < clauses.size(); i++)
        if(!satisfied(ca[clauses[i]])) {
            Clause &c = ca[clauses[i]];
            for(int j = 0; j < c.size(); j++)
                if(value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for(int i = 0; i < assumptions.size(); i++) {
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max) + 1);
    }

    for(int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if(verbosity > 0)
        printf("Wrote %d clauses with %d variables.\n", cnt, max);
}